

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

const_reference __thiscall
google::protobuf::RepeatedField<long>::Get(RepeatedField<long> *this,int index)

{
  int iVar1;
  Nonnull<const_char_*> failure_msg;
  long *plVar2;
  LogMessageFatal local_20;
  
  failure_msg = absl::lts_20250127::log_internal::Check_GEImpl(index,0,"index >= 0");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    iVar1 = size(this);
    failure_msg = absl::lts_20250127::log_internal::Check_LTImpl(index,iVar1,"index < size()");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      plVar2 = elements(this,(undefined1  [16])
                             ((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                             (undefined1  [16])0x0);
      return plVar2 + index;
    }
    iVar1 = 0x32c;
  }
  else {
    iVar1 = 0x32b;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
             ,iVar1,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

inline const Element& RepeatedField<Element>::Get(int index) const
    ABSL_ATTRIBUTE_LIFETIME_BOUND {
  if constexpr (internal::GetBoundsCheckMode() ==
                internal::BoundsCheckMode::kAbort) {
    internal::RuntimeAssertInBounds(index, size());
  } else {
    ABSL_DCHECK_GE(index, 0);
    ABSL_DCHECK_LT(index, size());
  }
  return elements(is_soo())[index];
}